

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_limit.cpp
# Opt level: O3

void __thiscall rate_limit::handle_connected(rate_limit *this,tcp_connection *conn)

{
  undefined8 uVar1;
  char *pcVar2;
  ostream *poVar3;
  ushort uVar4;
  allocator local_39;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  uVar1 = ranger::event::tcp_connection::remote_endpoint();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"connection[",0xb);
  pcVar2 = inet_ntoa((in_addr)(in_addr_t)((ulong)uVar1 >> 0x20));
  std::__cxx11::string::string((string *)&local_38,pcVar2,&local_39);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  uVar4 = (ushort)((ulong)uVar1 >> 0x10);
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)poVar3,(uint)(ushort)(uVar4 << 8 | uVar4 >> 8));
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] connected.",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void handle_connected(ranger::event::tcp_connection& conn) {
		auto ep = conn.remote_endpoint();
		std::cout << "connection[" << ep << "] connected." << std::endl;
	}